

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pre-process.c
# Opt level: O3

void expand_list(dmr_C *C,token **list)

{
  int iVar1;
  token *ptVar2;
  
LAB_001207f7:
  ptVar2 = *list;
  if (((ulong)ptVar2->pos & 0x3f) == 0x19) {
    do {
      (ptVar2->field_2).number[0x11] = (ptVar2->field_2).number[0x11] & 0xfe;
      ptVar2 = ptVar2->next;
    } while (((ulong)ptVar2->pos & 0x3f) == 0x19);
    *list = ptVar2;
  }
  if (ptVar2 == &dmrC_eof_token_entry_) {
    return;
  }
  if (((ulong)ptVar2->pos & 0x3f) == 2) goto code_r0x00120834;
  goto LAB_00120843;
code_r0x00120834:
  iVar1 = expand_one_symbol(C,list);
  if (iVar1 != 0) {
LAB_00120843:
    list = &ptVar2->next;
  }
  goto LAB_001207f7;
}

Assistant:

static void expand_list(struct dmr_C *C, struct token **list)
{
	struct token *next;
	while (!dmrC_eof_token(next = scan_next(C, list))) {
		if (dmrC_token_type(next) != TOKEN_IDENT || expand_one_symbol(C, list))
			list = &next->next;
	}
}